

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined4 uVar3;
  char cVar4;
  bool bVar5;
  uint8_t value_00;
  bool bVar6;
  size_t offset;
  size_t sVar7;
  int *piVar8;
  pointer __nptr;
  iterator pcVar9;
  size_type sVar10;
  Diagnostic *this_00;
  ulong in_R9;
  undefined1 auVar11 [16];
  Token TVar12;
  span<const_slang::logic_t,_18446744073709551615UL> local_160;
  SVInt local_150;
  undefined4 local_140;
  undefined4 local_13c;
  double dStack_138;
  bitwidth_t bits;
  double bitsDbl;
  SVInt intVal;
  double dStack_118;
  bool outOfRange;
  double value;
  char *end;
  DiagCode local_100;
  byte local_f9;
  DiagCode local_f8;
  int iStack_f4;
  bool any_1;
  char local_ee;
  byte local_ed;
  int index;
  DiagSubsystem DStack_e8;
  uint16_t uStack_e6;
  bool hasDecimal;
  char c;
  optional<slang::TimeUnit> timeSuffix;
  char c_2;
  bool any;
  undefined1 local_d8 [8];
  anon_class_16_2_832c79d4 populateChars;
  undefined1 local_b0 [7];
  char c_1;
  SmallVector<char,_40UL> floatChars;
  SmallVector<slang::logic_t,_40UL> digits;
  size_t startOfNum;
  int i;
  Lexer *this_local;
  
  for (startOfNum._4_4_ = 0;
      (startOfNum._4_4_ < 5 &&
      (cVar4 = peek(this,startOfNum._4_4_), cVar4 == "1step"[startOfNum._4_4_]));
      startOfNum._4_4_ = startOfNum._4_4_ + 1) {
    if (startOfNum._4_4_ == 4) {
      advance(this,5);
      TVar12 = create<>(this,OneStep);
      return TVar12;
    }
  }
  while (cVar4 = peek(this), cVar4 == '0') {
    advance(this);
  }
  offset = currentOffset(this);
  SmallVector<slang::logic_t,_40UL>::SmallVector
            ((SmallVector<slang::logic_t,_40UL> *)&floatChars.field_0x38);
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)local_b0);
  while( true ) {
    while (cVar4 = peek(this), cVar4 == '_') {
      advance(this);
    }
    bVar5 = isDecimalDigit(cVar4);
    if (!bVar5) break;
    value_00 = getDigitValue(cVar4);
    logic_t::logic_t((logic_t *)((long)&populateChars.floatChars + 3),value_00);
    SmallVectorBase<slang::logic_t>::push_back
              ((SmallVectorBase<slang::logic_t> *)&floatChars.field_0x38,
               (logic_t *)((long)&populateChars.floatChars + 3));
    advance(this);
  }
  local_d8 = (undefined1  [8])&floatChars.field_0x38;
  populateChars.digits = (SmallVector<slang::logic_t,_40UL> *)local_b0;
  cVar4 = peek(this);
  if (cVar4 == '.') {
    advance(this);
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()((anon_class_16_2_832c79d4 *)local_d8);
    any = true;
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,&any);
    cVar4 = peek(this);
    if (cVar4 == '_') {
      sVar7 = currentOffset(this);
      addDiag(this,(DiagCode)0x50002,sVar7);
    }
    bVar5 = false;
    while( true ) {
      while (timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeUnit>._M_engaged = (bool)peek(this),
            timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeUnit>._M_engaged == true) {
        advance(this);
      }
      bVar6 = isDecimalDigit(timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload
                             .super__Optional_payload_base<slang::TimeUnit>._M_engaged);
      if (!bVar6) break;
      bVar5 = true;
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)local_b0,
                 &timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::TimeUnit>._M_engaged);
      advance(this);
    }
    if (!bVar5) {
      DStack_e8 = Lexer;
      uStack_e6 = 0xd;
      sVar7 = currentOffset(this);
      addDiag(this,_DStack_e8,sVar7);
      index._3_1_ = 0x30;
      SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,(char *)((long)&index + 3))
      ;
    }
  }
  std::optional<slang::TimeUnit>::optional((optional<slang::TimeUnit> *)((long)&index + 1));
  index._0_1_ = peek(this);
  if (((char)index == 'e') || ((char)index == 'E')) {
    bVar5 = SmallVectorBase<char>::empty((SmallVectorBase<char> *)local_b0);
    local_ed = (bVar5 ^ 0xffU) & 1;
    if (local_ed == 0) {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()((anon_class_16_2_832c79d4 *)local_d8);
    }
    local_ee = 'e';
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,&local_ee);
    iStack_f4 = 1;
    index._0_1_ = peek(this,1);
    if (((char)index == '+') || ((char)index == '-')) {
      SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,(char *)&index);
      iStack_f4 = iStack_f4 + 1;
      index._0_1_ = peek(this,iStack_f4);
    }
    if (((char)index == '_') && ((local_ed & 1) != 0)) {
      local_f8.subsystem = Lexer;
      local_f8.code = 5;
      sVar7 = currentOffset(this);
      addDiag(this,local_f8,sVar7);
    }
    local_f9 = 0;
    while( true ) {
      while ((char)index == '_') {
        iStack_f4 = iStack_f4 + 1;
        index._0_1_ = peek(this,iStack_f4);
      }
      bVar5 = isDecimalDigit((char)index);
      if (!bVar5) break;
      local_f9 = 1;
      SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,(char *)&index);
      iStack_f4 = iStack_f4 + 1;
      index._0_1_ = peek(this,iStack_f4);
    }
    if (((local_f9 & 1) == 0) && ((local_ed & 1) == 0)) {
      SmallVectorBase<char>::clear((SmallVectorBase<char> *)local_b0);
    }
    else {
      advance(this,iStack_f4);
      if ((local_f9 & 1) == 0) {
        local_100.subsystem = Lexer;
        local_100.code = 0xc;
        sVar7 = currentOffset(this);
        addDiag(this,local_100,sVar7);
        end._7_1_ = 0x31;
        SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,(char *)((long)&end + 7))
        ;
      }
    }
  }
  else {
    end._5_2_ = (_Optional_payload_base<slang::TimeUnit>)lexTimeLiteral(this);
    index._1_2_ = end._5_2_;
    bVar5 = std::optional::operator_cast_to_bool((optional *)((long)&index + 1));
    if ((bVar5) && (bVar5 = SmallVectorBase<char>::empty((SmallVectorBase<char> *)local_b0), bVar5))
    {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()((anon_class_16_2_832c79d4 *)local_d8);
    }
  }
  bVar5 = SmallVectorBase<char>::empty((SmallVectorBase<char> *)local_b0);
  if (bVar5) {
    SVInt::SVInt((SVInt *)&bitsDbl);
    bVar5 = SmallVectorBase<slang::logic_t>::empty
                      ((SmallVectorBase<slang::logic_t> *)&floatChars.field_0x38);
    dVar2 = BitsPerDecimal;
    if (!bVar5) {
      sVar10 = SmallVectorBase<slang::logic_t>::size
                         ((SmallVectorBase<slang::logic_t> *)&floatChars.field_0x38);
      auVar11._8_4_ = (int)(sVar10 >> 0x20);
      auVar11._0_8_ = sVar10;
      auVar11._12_4_ = 0x45300000;
      dStack_138 = ceil(dVar2 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)));
      if (16777215.0 < dStack_138) {
        local_140 = 0x20003;
        this_00 = addDiag(this,(DiagCode)0x20003,offset);
        Diagnostic::operator<<(this_00,0xffffff);
        local_13c = 0xffffff;
      }
      else {
        local_13c = (undefined4)(long)dStack_138;
      }
      uVar3 = local_13c;
      nonstd::span_lite::span<const_slang::logic_t,_18446744073709551615UL>::
      span<slang::SmallVector<slang::logic_t,_40UL>,_0>
                (&local_160,(SmallVector<slang::logic_t,_40UL> *)&floatChars.field_0x38);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_R9;
      SVInt::fromDigits((bitwidth_t)&local_150,(LiteralBase)uVar3,true,false,
                        (span<const_slang::logic_t,_18446744073709551615UL>)(auVar1 << 0x40));
      SVInt::operator=((SVInt *)&bitsDbl,&local_150);
      SVInt::~SVInt(&local_150);
      SVInt::shrinkToFit((SVInt *)&bitsDbl);
    }
    _this_local = create<slang::SVInt&>(this,IntegerLiteral,(SVInt *)&bitsDbl);
    intVal.super_SVIntStorage.bitWidth = 1;
    SVInt::~SVInt((SVInt *)&bitsDbl);
  }
  else {
    end._4_1_ = 0;
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_b0,(char *)((long)&end + 4));
    piVar8 = __errno_location();
    *piVar8 = 0;
    __nptr = SmallVectorBase<char>::data((SmallVectorBase<char> *)local_b0);
    dStack_118 = strtod(__nptr,(char **)&value);
    pcVar9 = SmallVectorBase<char>::end((SmallVectorBase<char> *)local_b0);
    if ((iterator)value != pcVar9 + -1) {
      assert::assertFailed
                ("end == floatChars.end() - 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
                 ,0x3d2,"Token slang::parsing::Lexer::lexNumericLiteral()");
    }
    piVar8 = __errno_location();
    intVal.super_SVIntStorage._15_1_ = *piVar8 == 0x22;
    bVar5 = std::optional::operator_cast_to_bool((optional *)((long)&index + 1));
    _this_local = create<double&,bool&,std::optional<slang::TimeUnit>&>
                            (this,bVar5 | RealLiteral,&stack0xfffffffffffffee8,
                             (bool *)&intVal.super_SVIntStorage.field_0xf,
                             (optional<slang::TimeUnit> *)((long)&index + 1));
    intVal.super_SVIntStorage.bitWidth = 1;
  }
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)local_b0);
  SmallVector<slang::logic_t,_40UL>::~SmallVector
            ((SmallVector<slang::logic_t,_40UL> *)&floatChars.field_0x38);
  return _this_local;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        if (peek() == '_')
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any) {
            addDiag(diag::MissingFractionalDigits, currentOffset());
            floatChars.push_back('0');
        }
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        if (c == '_' && hasDecimal)
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any) {
                addDiag(diag::MissingExponentDigits, currentOffset());
                floatChars.push_back('1');
            }
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}